

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<const_Interface_ProblemToPolicyDiscretePure> * __thiscall
boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::operator=
          (shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *this,
          shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *r)

{
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *in_RDI;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x98972e);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }